

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afk.cc
# Opt level: O0

void __thiscall AfkProcessor::flow_print(AfkProcessor *this,Params *args)

{
  FlowString *pFVar1;
  ostream *poVar2;
  Params *args_local;
  AfkProcessor *this_local;
  
  pFVar1 = flow::Params::getString_abi_cxx11_(args,1);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)pFVar1);
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void AfkProcessor::flow_print(flow::Params& args) {
  std::cout << args.getString(1) << '\n';
}